

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gim_memory.cpp
# Opt level: O0

void * gim_alloc(size_t size)

{
  size_t in_RDI;
  void *ptr;
  undefined8 local_10;
  
  if (g_allocfn == (undefined1 *)0x0) {
    local_10 = malloc(in_RDI);
  }
  else {
    local_10 = (void *)(*(code *)g_allocfn)(in_RDI);
  }
  return local_10;
}

Assistant:

void * gim_alloc(size_t size)
{
	void * ptr;
	if (g_allocfn)
	{
		ptr = g_allocfn(size);
	}
	else
	{
#ifdef GIM_SIMD_MEMORY
		ptr = btAlignedAlloc(size,16);
#else
		ptr = malloc(size);
#endif
	}
  	return ptr;
}